

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_extensions.cpp
# Opt level: O2

void CATCH2_INTERNAL_TEMPLATE_TEST_45<false,target_t,std::strong_ordering>(void)

{
  StringRef message;
  StringRef macroName;
  ReusableStringStream local_88;
  string local_70;
  AssertionHandler catchAssertionHandler;
  
  local_70._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_25/DNKpp[P]Simple-Utility/tests/concepts/stl_extensions.cpp"
  ;
  local_70._M_string_length = 0x137;
  macroName.m_size = 7;
  macroName.m_start = "SUCCEED";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName,(SourceLineInfo *)&local_70,
             (StringRef)ZEXT816(0x32dce1),ContinueOnFailure);
  local_88.m_index = 0;
  local_88.m_oss = (ostream *)0x0;
  Catch::ReusableStringStream::ReusableStringStream(&local_88);
  std::operator<<(local_88.m_oss,
                  "expected == nothrow_weakly_three_way_comparable<T, MinimalCategory>");
  Catch::ReusableStringStream::str_abi_cxx11_(&local_70,&local_88);
  message.m_size = local_70._M_string_length;
  message.m_start = local_70._M_dataplus._M_p;
  Catch::AssertionHandler::handleMessage(&catchAssertionHandler,Ok,message);
  std::__cxx11::string::~string((string *)&local_70);
  Catch::ReusableStringStream::~ReusableStringStream(&local_88);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  return;
}

Assistant:

target_t(int)
	{
	}